

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O2

nng_err http_parse_header(nng_http *conn,void *line)

{
  nng_err nVar1;
  char *__s;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  
  __s = strchr((char *)line,0x3a);
  if (__s != (char *)0x0) {
    *__s = '\0';
    do {
      do {
        pcVar4 = __s;
        __s = pcVar4 + 1;
      } while (pcVar4[1] == '\t');
    } while (pcVar4[1] == ' ');
    sVar2 = strlen(__s);
    for (lVar3 = sVar2 + 1;
        (2 < lVar3 && ((pcVar4[lVar3 + -1] == ' ' || (pcVar4[lVar3 + -1] == '\t'))));
        lVar3 = lVar3 + -1) {
      pcVar4[lVar3 + -1] = '\0';
    }
    nVar1 = nni_http_add_header(conn,(char *)line,__s);
    return nVar1;
  }
  return NNG_EPROTO;
}

Assistant:

static nng_err
http_parse_header(nng_http *conn, void *line)
{
	char *key = line;
	char *val;
	char *end;

	// Find separation between key and value
	if ((val = strchr(key, ':')) == NULL) {
		return (NNG_EPROTO);
	}

	// Trim leading and trailing whitespace from header
	*val = '\0';
	val++;
	while (*val == ' ' || *val == '\t') {
		val++;
	}
	end = val + strlen(val);
	end--;
	while ((end > val) && (*end == ' ' || *end == '\t')) {
		*end = '\0';
		end--;
	}

	return (nni_http_add_header(conn, key, val));
}